

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cc
# Opt level: O0

void __thiscall brown::Simulator::renderLoop(Simulator *this,Tile *dd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  App *pAVar6;
  int iVar7;
  int iVar8;
  int y1;
  uint32_t uVar9;
  uintptr_t uVar10;
  uint32_t *puVar11;
  long lVar12;
  size_t sVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  int local_e0;
  int local_d0;
  long local_b8;
  int local_68;
  int local_64;
  int i1;
  int i0;
  int x;
  int ox;
  int x_2;
  int bstatus;
  int dmousy;
  int dmousx;
  int mousy;
  int mousx;
  char *keystatus;
  long lStack_30;
  int x_1;
  uint32_t *wptr;
  App *pAStack_20;
  int y;
  App *app;
  Tile *dd_local;
  Simulator *this_local;
  
  pAStack_20 = this->app;
  app = (App *)dd;
  dd_local = (Tile *)this;
  iVar7 = Tile::gety(dd);
  if (iVar7 < this->BMPYRES) {
    wptr._4_4_ = Tile::gety((Tile *)app);
  }
  else {
    wptr._4_4_ = this->BMPYRES;
  }
  while (pAVar6 = app, wptr._4_4_ = wptr._4_4_ + -1, -1 < wptr._4_4_) {
    iVar7 = Tile::getp((Tile *)app);
    iVar7 = iVar7 * wptr._4_4_;
    uVar10 = Tile::getf((Tile *)app);
    lStack_30 = (long)iVar7 + uVar10;
    iVar7 = Tile::getx((Tile *)app);
    if (iVar7 < this->BMPXRES) {
      keystatus._4_4_ = Tile::getx((Tile *)app);
    }
    else {
      keystatus._4_4_ = this->BMPXRES;
    }
    while (keystatus._4_4_ = keystatus._4_4_ + -1, -1 < keystatus._4_4_) {
      puVar11 = Tile::getpix(&this->drawing,keystatus._4_4_,wptr._4_4_);
      *(uint32_t *)(lStack_30 + (long)keystatus._4_4_ * 4) = *puVar11;
    }
  }
  iVar7 = this->BMPXRES;
  iVar8 = Tile::getx((Tile *)app);
  Tile::drawrectfill((Tile *)pAVar6,iVar7,0,iVar8,this->BMPYRES,0);
  pAVar6 = app;
  iVar7 = this->BMPYRES;
  iVar8 = Tile::getx((Tile *)app);
  y1 = Tile::gety((Tile *)app);
  Tile::drawrectfill((Tile *)pAVar6,0,iVar7,iVar8,y1,0);
  if ((this->odown & 1U) == 0) {
    Tile::drawcirc((Tile *)app,(this->acur[0] >> 6) + (this->BMPXRES >> 1),
                   (this->acur[1] >> 6) + (this->BMPYRES >> 1),0x14,0xff0000);
  }
  else {
    Tile::drawcirc((Tile *)app,(this->acur[0] >> 6) + (this->BMPXRES >> 1),
                   (this->acur[1] >> 6) + (this->BMPYRES >> 1),0x14,0xff00);
  }
  sVar13 = this->fifn;
  Tile::print6x8((Tile *)app,0,0,0xffffff,0,"%.2f sec, fifn=%d",
                 (double)this->pclk / (double)this->CLKFRQ,sVar13);
  uVar15 = (undefined4)(sVar13 >> 0x20);
  _mousy = App::getKeyStatus(pAStack_20);
  App::getMouseStatus(pAStack_20,&dmousx,&dmousy,&bstatus,&x_2,&ox);
  renderLoop::otim = renderLoop::tim;
  uVar9 = App::getTime(pAStack_20);
  renderLoop::tim = (double)uVar9 * 0.001;
  renderLoop::dtim = renderLoop::tim - renderLoop::otim;
  this->xoff = (long)((double)((long)((int)_mousy[0xcd] - (int)_mousy[0xcb]) * this->zoom * 0x200) *
                      renderLoop::dtim + (double)this->xoff);
  if ((ox & 2U) != 0) {
    this->xoff = (long)bstatus * this->zoom + this->xoff;
    if (this->zoom + (this->zoom * (long)x_2) / 100 < 0x65) {
      local_b8 = 100;
    }
    else {
      local_b8 = this->zoom + (this->zoom * (long)x_2) / 100;
    }
    if (local_b8 < 10000000) {
      if (this->zoom + (this->zoom * (long)x_2) / 100 < 0x65) {
        local_d0 = 100;
      }
      else {
        local_d0 = (int)this->zoom + (int)((this->zoom * (long)x_2) / 100);
      }
      local_e0 = local_d0;
    }
    else {
      local_e0 = 10000000;
    }
    renderLoop::i = local_e0;
    this->xoff = (this->zoom - (long)local_e0) * (long)dmousx + this->xoff;
    this->zoom = (long)renderLoop::i;
  }
  if (this->fault != 0) {
    iVar7 = (int)((this->faultclk - this->xoff) / this->zoom);
    if (this->fault >> 1 == 1) {
      uVar14 = CONCAT44(uVar15,(this->fault & 1U) + 0x78);
      Tile::print6x8((Tile *)app,iVar7,0x25d,0xff8080,0,"fault: %c div by 0",uVar14);
      uVar15 = (undefined4)((ulong)uVar14 >> 0x20);
    }
    if (this->fault >> 1 == 2) {
      uVar14 = CONCAT44(uVar15,(this->fault & 1U) + 0x78);
      Tile::print6x8((Tile *)app,iVar7,0x25d,0xff8080,0,"fault: %c dir change at hi veloc",uVar14);
      uVar15 = (undefined4)((ulong)uVar14 >> 0x20);
    }
    if (this->fault >> 1 == 3) {
      uVar14 = CONCAT44(uVar15,(this->fault & 1U) + 0x78);
      Tile::print6x8((Tile *)app,iVar7,0x25d,0xff8080,0,"fault: %c veloc too high",uVar14);
      uVar15 = (undefined4)((ulong)uVar14 >> 0x20);
    }
    if (this->fault >> 1 == 4) {
      Tile::print6x8((Tile *)app,iVar7,0x25d,0xff8080,0,"fault: %c accel too high",
                     CONCAT44(uVar15,(this->fault & 1U) + 0x78));
    }
    Tile::drawline((Tile *)app,(float)iVar7,615.0,(float)iVar7,815.0,0xff8080);
  }
  lVar12 = this->xoff;
  lVar1 = this->zoom;
  lVar2 = this->fifclk[this->fifn - 1];
  lVar3 = this->xoff;
  lVar4 = this->zoom;
  for (renderLoop::i = 0; renderLoop::i < 5; renderLoop::i = renderLoop::i + 1) {
    Tile::drawrectfill((Tile *)app,(int)(-lVar12 / lVar1),renderLoop::i * 0x28 + 0x267,
                       (int)((lVar2 - lVar3) / lVar4),renderLoop::i * 0x28 + 0x285,0x404040);
  }
  i0 = 0;
  renderLoop::dpx = -1;
  renderLoop::dpy = -1;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SUB168(SEXT816(0x40000000),8);
  renderLoop::rzoom = SUB168((auVar5 << 0x40 | ZEXT816(0x40000000)) / SEXT816(this->zoom),0) << 2;
  for (renderLoop::i = 0; (ulong)(long)renderLoop::i < this->fifn; renderLoop::i = renderLoop::i + 1
      ) {
    lVar12 = (this->fifclk[renderLoop::i] - this->xoff) * renderLoop::rzoom;
    iVar7 = (int)((ulong)lVar12 >> 0x20);
    if (-1 < lVar12) {
      if ((renderLoop::dpx < iVar7) && ((this->fifbit[renderLoop::i] & 1U) != 0)) {
        renderLoop::dpx = iVar7;
        Tile::drawline((Tile *)app,(float)iVar7,615.0,(float)iVar7,645.0,0xffffff);
      }
      if ((renderLoop::dpy < iVar7) && ((this->fifbit[renderLoop::i] & 2U) != 0)) {
        renderLoop::dpy = iVar7;
        Tile::drawline((Tile *)app,(float)iVar7,695.0,(float)iVar7,725.0,0xffffff);
      }
      if (0 < renderLoop::i) {
        Tile::drawline((Tile *)app,(float)i0,
                       (float)(int)(((int)this->fifbit[renderLoop::i + -1] >> 2 & 1U) * -0x1e +
                                   0x2ad),(float)iVar7,
                       (float)(int)(((int)this->fifbit[renderLoop::i + -1] >> 2 & 1U) * -0x1e +
                                   0x2ad),0xffffff);
        Tile::drawline((Tile *)app,(float)iVar7,
                       (float)(int)(((int)this->fifbit[renderLoop::i + -1] >> 2 & 1U) * -0x1e +
                                   0x2ad),(float)iVar7,
                       (float)(int)(((int)this->fifbit[renderLoop::i] >> 2 & 1U) * -0x1e + 0x2ad),
                       0xffffff);
        Tile::drawline((Tile *)app,(float)i0,
                       (float)(int)(((int)this->fifbit[renderLoop::i + -1] >> 3 & 1U) * -0x1e +
                                   0x2fd),(float)iVar7,
                       (float)(int)(((int)this->fifbit[renderLoop::i + -1] >> 3 & 1U) * -0x1e +
                                   0x2fd),0xffffff);
        Tile::drawline((Tile *)app,(float)iVar7,
                       (float)(int)(((int)this->fifbit[renderLoop::i + -1] >> 3 & 1U) * -0x1e +
                                   0x2fd),(float)iVar7,
                       (float)(int)(((int)this->fifbit[renderLoop::i] >> 3 & 1U) * -0x1e + 0x2fd),
                       0xffffff);
        Tile::drawline((Tile *)app,(float)i0,
                       (float)(int)(((int)this->fifbit[renderLoop::i + -1] >> 4 & 1U) * -0x1e +
                                   0x325),(float)iVar7,
                       (float)(int)(((int)this->fifbit[renderLoop::i + -1] >> 4 & 1U) * -0x1e +
                                   0x325),0xffffff);
        Tile::drawline((Tile *)app,(float)iVar7,
                       (float)(int)(((int)this->fifbit[renderLoop::i + -1] >> 4 & 1U) * -0x1e +
                                   0x325),(float)iVar7,
                       (float)(int)(((int)this->fifbit[renderLoop::i] >> 4 & 1U) * -0x1e + 0x325),
                       0xffffff);
      }
      iVar8 = Tile::getx((Tile *)app);
      i0 = iVar7;
      if (iVar8 <= iVar7) break;
    }
  }
  for (renderLoop::i = 0; (ulong)(long)renderLoop::i < this->fifn; renderLoop::i = renderLoop::i + 1
      ) {
    if ((long)dmousx * this->zoom + this->xoff <= this->fifclk[renderLoop::i]) {
      uVar9 = 0xff0000;
      if ((this->fifbit[renderLoop::i] & 0x10U) != 0) {
        uVar9 = 0xff00;
      }
      Tile::drawcirc((Tile *)app,(this->fifcurx[renderLoop::i] >> 6) + (this->BMPXRES >> 1),
                     (this->fifcury[renderLoop::i] >> 6) + (this->BMPYRES >> 1),5,uVar9);
      local_64 = renderLoop::i;
      goto LAB_00108d6c;
    }
  }
  goto LAB_001090a6;
  while ((this->fifbit[local_64] & 1U) == 0) {
LAB_00108d6c:
    local_64 = local_64 + -1;
    if (local_64 < 1) break;
  }
  local_68 = renderLoop::i;
  while (((ulong)(long)local_68 < this->fifn - 1 && ((this->fifbit[local_68] & 1U) == 0))) {
    local_68 = local_68 + 1;
  }
  iVar7 = renderLoop::i;
  if (-1 < local_64) {
    Tile::drawline((Tile *)app,(float)((this->fifclk[local_64] - this->xoff) / this->zoom),628.0,
                   (float)((this->fifclk[local_68] - this->xoff) / this->zoom),628.0,0x808080);
    Tile::print6x8((Tile *)app,dmousx + 2,0x26c,0xffffff,0,"%d clk",
                   this->fifclk[local_68] - this->fifclk[local_64]);
    Tile::print6x8((Tile *)app,dmousx + 2,0x276,0xffffff,0,"(%.1f Hz)",
                   (double)this->CLKFRQ / (double)(this->fifclk[local_68] - this->fifclk[local_64]))
    ;
    iVar7 = renderLoop::i;
  }
  do {
    local_64 = iVar7 + -1;
    if (local_64 < 1) break;
    iVar7 = local_64;
  } while ((this->fifbit[local_64] & 2U) == 0);
  local_68 = renderLoop::i;
  while (((ulong)(long)local_68 < this->fifn - 1 && ((this->fifbit[local_68] & 2U) == 0))) {
    local_68 = local_68 + 1;
  }
  if (-1 < local_64) {
    Tile::drawline((Tile *)app,(float)((this->fifclk[local_64] - this->xoff) / this->zoom),708.0,
                   (float)((this->fifclk[local_68] - this->xoff) / this->zoom),708.0,0x808080);
    Tile::print6x8((Tile *)app,dmousx + 2,700,0xffffff,0,"%d clk",
                   this->fifclk[local_68] - this->fifclk[local_64]);
    Tile::print6x8((Tile *)app,dmousx + 2,0x2c6,0xffffff,0,"(%.1f Hz)",
                   (double)this->CLKFRQ / (double)(this->fifclk[local_68] - this->fifclk[local_64]))
    ;
  }
LAB_001090a6:
  Tile::drawline((Tile *)app,(float)dmousx,615.0,(float)dmousx,815.0,0x406080);
  Tile::print6x8((Tile *)app,dmousx,0x25f,0xffffff,0,"%.6f sec",
                 (double)((long)dmousx * this->zoom + this->xoff) / (double)this->CLKFRQ);
  Tile::print6x8((Tile *)app,5,0x274,0xffffff,0,"X Pulse:");
  Tile::print6x8((Tile *)app,5,0x29c,0xffffff,0,"X Dir:");
  Tile::print6x8((Tile *)app,5,0x2c4,0xffffff,0,"Y Pulse:");
  Tile::print6x8((Tile *)app,5,0x2ec,0xffffff,0,"Y Dir:");
  Tile::print6x8((Tile *)app,5,0x314,0xffffff,0,"Pen Down:");
  return;
}

Assistant:

void Simulator::renderLoop(Tile& dd) {
    App& app = *this->app;

    /* Copy drawing to texture */
    for(int y = min(dd.gety(),BMPYRES)-1; y >= 0; y--) {
        uint32_t* wptr = reinterpret_cast<uint32_t*>(dd.getp()*y + dd.getf());
        for(int x = min(dd.getx(),BMPXRES)-1; x >= 0; x--) {
            wptr[x] = drawing.getpix(x, y);
        }
    }

    /* Fill in the blank */
    dd.drawrectfill(BMPXRES, 0, dd.getx(), BMPYRES, BACKGROUND_COLOR);
    dd.drawrectfill(0, BMPYRES, dd.getx(), dd.gety(), BACKGROUND_COLOR);

    /* Draw pen location */
    if (!odown) {
        dd.drawcirc((acur[0]>>6)+(BMPXRES>>1), (acur[1]>>6)+(BMPYRES>>1), 20, UP_LOC_COLOR);
    } else {
        dd.drawcirc((acur[0]>>6)+(BMPXRES>>1), (acur[1]>>6)+(BMPYRES>>1), 20, DOWN_LOC_COLOR);
    }

    /* Show timing info */
    dd.print6x8(0,0,0xffffff,BACKGROUND_COLOR,"%.2f sec, fifn=%d",(double)pclk/CLKFRQ,fifn);

#if ENABLE_SCOPE
    /* Scope, timing plot */
    static int64_t rzoom;
    static double tim = 0.0, otim, dtim;
    static int i, dpx, dpy;

    // Get app status
    const char* keystatus = app.getKeyStatus();
    int mousx, mousy, dmousx, dmousy, bstatus;
    app.getMouseStatus(mousx, mousy, dmousx, dmousy, bstatus);

    // Pan left/right with arrow keys
    otim = tim;
    tim = static_cast<double>(app.getTime())*.001;
    dtim = tim-otim;
    xoff += (keystatus[0xcd]-keystatus[0xcb])*zoom*512*dtim;

    // Zoom and pan with mouse
    if (bstatus & 1<<1) { // right mouse botton down
        // pan
        xoff += dmousx * zoom;
        // zoom
        i = min(max(zoom+(zoom*dmousy)/100,100),10000000);
        xoff += (zoom-i)*mousx;
        zoom = i;
    }

    // Error message
    if (fault) {
        int x = (faultclk-xoff)/zoom;
        if ((fault>>1) == 1) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c div by 0",(fault&1)+'x');
        if ((fault>>1) == 2) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c dir change at hi veloc",(fault&1)+'x');
        if ((fault>>1) == 3) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c veloc too high",(fault&1)+'x');
        if ((fault>>1) == 4) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c accel too high",(fault&1)+'x');
        dd.drawline(x,YOFF,x,YOFF+200,0xff8080);
    }

    // Scope background
    int ox = (0-xoff)/zoom;
    int x  = (fifclk[fifn-1]-xoff)/zoom;
    for(i=0;i<5;i++) {
         dd.drawrectfill(ox,YOFF+i*40,x,YOFF+30+i*40,0x404040);
    }
    ox = 0; dpx = -1; dpy = -1;
    rzoom = (((1<<30)/zoom)<<2);

    // Scope data
     for(i=0;i<fifn;i++)
     {
         x = (((fifclk[i]-xoff)*rzoom)>>32); if (x < 0) continue;
         if ((x > dpx) && (fifbit[i]&1)) { dpx = x; dd.drawline(x,YOFF   ,x,YOFF+ 30,0xffffff); }
         if ((x > dpy) && (fifbit[i]&2)) { dpy = x; dd.drawline(x,YOFF+80,x,YOFF+110,0xffffff); }
         if (i > 0)
         {
             dd.drawline(ox,((fifbit[i-1]>>2)&1)*-30+YOFF+ 70,x,((fifbit[i-1]>>2)&1)*-30+YOFF+70,0xffffff);
             dd.drawline(x,((fifbit[i-1]>>2)&1)*-30+YOFF+ 70,x,((fifbit[i  ]>>2)&1)*-30+YOFF+70,0xffffff);

             dd.drawline(ox,((fifbit[i-1]>>3)&1)*-30+YOFF+150,x,((fifbit[i-1]>>3)&1)*-30+YOFF+150,0xffffff);
             dd.drawline( x,((fifbit[i-1]>>3)&1)*-30+YOFF+150,x,((fifbit[i  ]>>3)&1)*-30+YOFF+150,0xffffff);

             dd.drawline(ox,((fifbit[i-1]>>4)&1)*-30+YOFF+190,x,((fifbit[i-1]>>4)&1)*-30+YOFF+190,0xffffff);
             dd.drawline( x,((fifbit[i-1]>>4)&1)*-30+YOFF+190,x,((fifbit[i  ]>>4)&1)*-30+YOFF+190,0xffffff);
         }
         ox = x; if (x >= dd.getx()) break;
     }

    // Scope annotation
     for(i=0;i<fifn;i++)
     {
         if (fifclk[i] >= mousx*zoom + xoff)
         {
             int i0, i1;
             dd.drawcirc((fifcurx[i]>>6)+(BMPXRES>>1),(fifcury[i]>>6)+(BMPYRES>>1),5,
                (fifbit[i] & (1<<4))? DOWN_LOC_COLOR : UP_LOC_COLOR);

             for(i0=i-1;i0> 0    ;i0--) if (fifbit[i0]&1) break;
             for(i1=i  ;i1<fifn-1;i1++) if (fifbit[i1]&1) break;
             if (i0 >= 0)
             {
                 dd.drawline((fifclk[i0]-xoff)/zoom,YOFF+13,(fifclk[i1]-xoff)/zoom,YOFF+13,0x808080);
                 dd.print6x8(mousx+2,YOFF+ 5,FONT_F_COLOR,FONT_B_COLOR,"%d clk",fifclk[i1]-fifclk[i0]);
                 dd.print6x8(mousx+2,YOFF+15,FONT_F_COLOR,FONT_B_COLOR,"(%.1f Hz)",CLKFRQ/(double)(fifclk[i1]-fifclk[i0]));
             }

             for(i0=i-1;i0> 0    ;i0--) if (fifbit[i0]&2) break;
             for(i1=i  ;i1<fifn-1;i1++) if (fifbit[i1]&2) break;
             if (i0 >= 0)
             {
                 dd.drawline((fifclk[i0]-xoff)/zoom,YOFF+93,(fifclk[i1]-xoff)/zoom,YOFF+93,0x808080);
                 dd.print6x8(mousx+2,YOFF+85,FONT_F_COLOR,FONT_B_COLOR,"%d clk",fifclk[i1]-fifclk[i0]);
                 dd.print6x8(mousx+2,YOFF+95,FONT_F_COLOR,FONT_B_COLOR,"(%.1f Hz)",CLKFRQ/(double)(fifclk[i1]-fifclk[i0]));
             }

             break;
         }
    }

    // Scope time cursor
    dd.drawline(mousx,YOFF,mousx,YOFF+200,0x406080);
    dd.print6x8(mousx,YOFF - 8,FONT_F_COLOR,FONT_B_COLOR,"%.6f sec",(double)(mousx*zoom + xoff)/CLKFRQ);

    // Scope captions
    dd.print6x8(5, YOFF+ 13, FONT_F_COLOR, FONT_B_COLOR, "X Pulse:");
    dd.print6x8(5, YOFF+ 53, FONT_F_COLOR, FONT_B_COLOR, "X Dir:");
    dd.print6x8(5, YOFF+ 93, FONT_F_COLOR, FONT_B_COLOR, "Y Pulse:");
    dd.print6x8(5, YOFF+133, FONT_F_COLOR, FONT_B_COLOR, "Y Dir:");
    dd.print6x8(5, YOFF+173, FONT_F_COLOR, FONT_B_COLOR, "Pen Down:");
#endif // ENABLE_SCOPE
}